

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

STRING_HANDLE IoTHubTransportHttp_GetHostname(TRANSPORT_LL_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  STRING_HANDLE result;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_GetHostname",0x89d,1,"invalid parameter handle=%p",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)STRING_clone(*handle);
    if (((STRING_HANDLE)l == (STRING_HANDLE)0x0) &&
       (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0)) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_GetHostname",0x8a2,1,
                "Cannot provide the target host name (STRING_clone failed).");
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

static STRING_HANDLE IoTHubTransportHttp_GetHostname(TRANSPORT_LL_HANDLE handle)
{
    STRING_HANDLE result;
    if (handle == NULL)
    {
        LogError("invalid parameter handle=%p", handle);
        result = NULL;
    }
    else if ((result = STRING_clone(((HTTPTRANSPORT_HANDLE_DATA*)(handle))->hostName)) == NULL)
    {
        LogError("Cannot provide the target host name (STRING_clone failed).");
    }

    return result;
}